

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSFieldIndex_abi_cxx11_
                   (FieldDescriptor *field)

{
  int iVar1;
  Type TVar2;
  Descriptor *this;
  Descriptor *this_00;
  Descriptor *pDVar3;
  FieldDescriptor *this_01;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  int i;
  Descriptor *parent_type;
  Descriptor *containing_type;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  AlphaNum *in_stack_ffffffffffffff98;
  int local_24;
  
  this = FieldDescriptor::containing_type(in_RSI);
  this_00 = Descriptor::containing_type(this);
  if (this_00 != (Descriptor *)0x0) {
    local_24 = 0;
    while (in_stack_ffffffffffffff64 = local_24, iVar1 = Descriptor::field_count(this_00),
          in_stack_ffffffffffffff64 < iVar1) {
      Descriptor::field(this_00,local_24);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)in_RDI);
      if (TVar2 == TYPE_GROUP) {
        Descriptor::field(this_00,local_24);
        pDVar3 = FieldDescriptor::message_type
                           ((FieldDescriptor *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (pDVar3 == this) {
          iVar1 = FieldDescriptor::number(in_RSI);
          this_01 = Descriptor::field(this_00,local_24);
          FieldDescriptor::number(this_01);
          strings::AlphaNum::AlphaNum
                    ((AlphaNum *)CONCAT44(in_stack_ffffffffffffff64,iVar1),in_stack_ffffffffffffff5c
                    );
          StrCat_abi_cxx11_(in_stack_ffffffffffffff98);
          return in_RDI;
        }
      }
      local_24 = local_24 + 1;
    }
  }
  FieldDescriptor::number(in_RSI);
  strings::AlphaNum::AlphaNum
            ((AlphaNum *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
  StrCat_abi_cxx11_(in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

std::string JSFieldIndex(const FieldDescriptor* field) {
  // Determine whether this field is a member of a group. Group fields are a bit
  // wonky: their "containing type" is a message type created just for the
  // group, and that type's parent type has a field with the group-message type
  // as its message type and TYPE_GROUP as its field type. For such fields, the
  // index we use is relative to the field number of the group submessage field.
  // For all other fields, we just use the field number.
  const Descriptor* containing_type = field->containing_type();
  const Descriptor* parent_type = containing_type->containing_type();
  if (parent_type != NULL) {
    for (int i = 0; i < parent_type->field_count(); i++) {
      if (parent_type->field(i)->type() == FieldDescriptor::TYPE_GROUP &&
          parent_type->field(i)->message_type() == containing_type) {
        return StrCat(field->number() - parent_type->field(i)->number());
      }
    }
  }
  return StrCat(field->number());
}